

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void test01(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  
  qpdf_read(qpdf,infile,password);
  uVar3 = qpdf_get_pdf_version(qpdf);
  printf("version: %s\n",uVar3);
  iVar1 = qpdf_get_pdf_extension_level(qpdf);
  if (0 < iVar1) {
    uVar2 = qpdf_get_pdf_extension_level(qpdf);
    printf("extension level: %d\n",(ulong)uVar2);
  }
  uVar2 = qpdf_is_linearized(qpdf);
  printf("linearized: %d\n",(ulong)uVar2);
  uVar2 = qpdf_is_encrypted(qpdf);
  printf("encrypted: %d\n",(ulong)uVar2);
  iVar1 = qpdf_is_encrypted(qpdf);
  if (iVar1 != 0) {
    uVar3 = qpdf_get_user_password(qpdf);
    printf("user password: %s\n",uVar3);
    uVar2 = qpdf_allow_accessibility(qpdf);
    printf("extract for accessibility: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_extract_all(qpdf);
    printf("extract for any purpose: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_print_low_res(qpdf);
    printf("print low resolution: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_print_high_res(qpdf);
    printf("print high resolution: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_modify_assembly(qpdf);
    printf("modify document assembly: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_modify_form(qpdf);
    printf("modify forms: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_modify_annotation(qpdf);
    printf("modify annotations: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_modify_other(qpdf);
    printf("modify other: %d\n",(ulong)uVar2);
    uVar2 = qpdf_allow_modify_all(qpdf);
    printf("modify anything: %d\n",(ulong)uVar2);
  }
  report_errors();
  return;
}

Assistant:

static void
test01(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    printf("version: %s\n", qpdf_get_pdf_version(qpdf));
    if (qpdf_get_pdf_extension_level(qpdf) > 0) {
        printf("extension level: %d\n", qpdf_get_pdf_extension_level(qpdf));
    }
    printf("linearized: %d\n", qpdf_is_linearized(qpdf));
    printf("encrypted: %d\n", qpdf_is_encrypted(qpdf));
    if (qpdf_is_encrypted(qpdf)) {
        printf("user password: %s\n", qpdf_get_user_password(qpdf));
        printf("extract for accessibility: %d\n", qpdf_allow_accessibility(qpdf));
        printf("extract for any purpose: %d\n", qpdf_allow_extract_all(qpdf));
        printf("print low resolution: %d\n", qpdf_allow_print_low_res(qpdf));
        printf("print high resolution: %d\n", qpdf_allow_print_high_res(qpdf));
        printf("modify document assembly: %d\n", qpdf_allow_modify_assembly(qpdf));
        printf("modify forms: %d\n", qpdf_allow_modify_form(qpdf));
        printf("modify annotations: %d\n", qpdf_allow_modify_annotation(qpdf));
        printf("modify other: %d\n", qpdf_allow_modify_other(qpdf));
        printf("modify anything: %d\n", qpdf_allow_modify_all(qpdf));
    }
    report_errors();
}